

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

void string_append(CHAR_DATA *ch,char **pString)

{
  char *pcVar1;
  size_t sVar2;
  
  send_to_char("-=======- Entering APPEND Mode -========-\n\r",ch);
  send_to_char("    Type .h on a new line for help\n\r",ch);
  send_to_char(" Terminate with a ~ or @ on a blank line.\n\r",ch);
  send_to_char("-=======================================-\n\r",ch);
  pcVar1 = *pString;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = palloc_string("");
    *pString = pcVar1;
  }
  send_to_char(pcVar1,ch);
  pcVar1 = *pString;
  sVar2 = strlen(pcVar1);
  if (pcVar1[sVar2 - 1] != '\r') {
    send_to_char("\n\r",ch);
  }
  ch->desc->pString = pString;
  return;
}

Assistant:

void string_append(CHAR_DATA *ch, char **pString)
{
	send_to_char("-=======- Entering APPEND Mode -========-\n\r", ch);
	send_to_char("    Type .h on a new line for help\n\r", ch);
	send_to_char(" Terminate with a ~ or @ on a blank line.\n\r", ch);
	send_to_char("-=======================================-\n\r", ch);

	if (*pString == nullptr)
		*pString = palloc_string("");

	send_to_char(*pString, ch);

	if (*(*pString + strlen(*pString) - 1) != '\r')
		send_to_char("\n\r", ch);

	ch->desc->pString = pString;
}